

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

uint8 * __thiscall
caffe::LayerParameter::InternalSerializeWithCachedSizesToArray
          (LayerParameter *this,bool deterministic,uint8 *target)

{
  float fVar1;
  int iVar2;
  string *psVar3;
  char *pcVar4;
  Rep *pRVar5;
  Rep *pRVar6;
  TransformationParameter *this_00;
  LossParameter *this_01;
  AccuracyParameter *this_02;
  ArgMaxParameter *this_03;
  ConcatParameter *this_04;
  ContrastiveLossParameter *this_05;
  ConvolutionParameter *this_06;
  DataParameter *this_07;
  DropoutParameter *this_08;
  DummyDataParameter *this_09;
  EltwiseParameter *this_10;
  ExpParameter *this_11;
  HDF5DataParameter *this_12;
  HDF5OutputParameter *this_13;
  HingeLossParameter *this_14;
  ImageDataParameter *this_15;
  InfogainLossParameter *this_16;
  InnerProductParameter *this_17;
  LRNParameter *this_18;
  MemoryDataParameter *this_19;
  MVNParameter *this_20;
  PoolingParameter *this_21;
  PowerParameter *this_22;
  ReLUParameter *this_23;
  SigmoidParameter *this_24;
  SoftmaxParameter *this_25;
  SliceParameter *this_26;
  TanHParameter *this_27;
  ThresholdParameter *this_28;
  WindowDataParameter *this_29;
  PythonParameter *this_30;
  PReLUParameter *this_31;
  SPPParameter *this_32;
  ReshapeParameter *this_33;
  LogParameter *this_34;
  FlattenParameter *this_35;
  ReductionParameter *this_36;
  EmbedParameter *this_37;
  TileParameter *this_38;
  BatchNormParameter *this_39;
  ELUParameter *this_40;
  BiasParameter *this_41;
  ScaleParameter *this_42;
  InputParameter *this_43;
  CropParameter *this_44;
  ParameterParameter *this_45;
  RecurrentParameter *this_46;
  void *pvVar7;
  bool bVar8;
  LayerParameter *pLVar9;
  uint uVar10;
  Type *pTVar11;
  LogMessage *pLVar12;
  Type *this_47;
  Type *this_48;
  Type *pTVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  byte *pbVar20;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar21;
  LogFinisher local_a9;
  LayerParameter *local_a8;
  LogMessage local_a0;
  LogMessage local_68;
  
  uVar16 = (this->_has_bits_).has_bits_[0];
  if ((uVar16 & 1) != 0) {
    psVar3 = (this->name_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "caffe.LayerParameter.name");
    psVar3 = (this->name_).ptr_;
    *target = '\n';
    target = google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray(psVar3,target + 1);
  }
  if ((uVar16 & 2) != 0) {
    psVar3 = (this->type_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "caffe.LayerParameter.type");
    psVar3 = (this->type_).ptr_;
    *target = 0x12;
    target = google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray(psVar3,target + 1);
  }
  iVar2 = (this->bottom_).super_RepeatedPtrFieldBase.current_size_;
  local_a8 = this;
  if (0 < iVar2) {
    pRVar21 = &this->bottom_;
    iVar19 = 0;
    do {
      pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&pRVar21->super_RepeatedPtrFieldBase,iVar19);
      pcVar4 = (pTVar11->_M_dataplus)._M_p;
      pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&pRVar21->super_RepeatedPtrFieldBase,iVar19);
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                (pcVar4,(int)pTVar11->_M_string_length,SERIALIZE,"caffe.LayerParameter.bottom");
      pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&pRVar21->super_RepeatedPtrFieldBase,iVar19);
      *target = 0x1a;
      target = google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray
                         (pTVar11,target + 1);
      iVar19 = iVar19 + 1;
    } while (iVar2 != iVar19);
  }
  iVar2 = (local_a8->top_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < iVar2) {
    pRVar21 = &local_a8->top_;
    iVar19 = 0;
    do {
      pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&pRVar21->super_RepeatedPtrFieldBase,iVar19);
      pcVar4 = (pTVar11->_M_dataplus)._M_p;
      pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&pRVar21->super_RepeatedPtrFieldBase,iVar19);
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                (pcVar4,(int)pTVar11->_M_string_length,SERIALIZE,"caffe.LayerParameter.top");
      pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&pRVar21->super_RepeatedPtrFieldBase,iVar19);
      *target = 0x22;
      target = google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray
                         (pTVar11,target + 1);
      iVar19 = iVar19 + 1;
    } while (iVar2 != iVar19);
  }
  pLVar9 = local_a8;
  uVar16 = (local_a8->loss_weight_).current_size_;
  if (uVar16 != 0) {
    if ((local_a8->loss_weight_).rep_ == (Rep *)0x0) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4e2);
      pLVar12 = google::protobuf::internal::LogMessage::operator<<(&local_68,"CHECK failed: rep_: ")
      ;
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_a0,pLVar12);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    pRVar5 = (pLVar9->loss_weight_).rep_;
    uVar15 = 1;
    if (1 < (int)uVar16) {
      uVar15 = (ulong)uVar16;
    }
    uVar17 = 0;
    do {
      fVar1 = pRVar5->elements[uVar17];
      *target = 0x2d;
      *(float *)(target + 1) = fVar1;
      target = target + 5;
      uVar17 = uVar17 + 1;
    } while (uVar15 != uVar17);
  }
  iVar2 = (pLVar9->param_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0) {
    iVar19 = 0;
    do {
      this_47 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::ParamSpec>::TypeHandler>
                          (&(pLVar9->param_).super_RepeatedPtrFieldBase,iVar19);
      *target = 0x32;
      pbVar20 = target + 1;
      uVar16 = this_47->_cached_size_;
      uVar14 = uVar16;
      if (0x7f < uVar16) {
        do {
          *pbVar20 = (byte)uVar16 | 0x80;
          uVar14 = uVar16 >> 7;
          pbVar20 = pbVar20 + 1;
          bVar8 = 0x3fff < uVar16;
          uVar16 = uVar14;
        } while (bVar8);
      }
      *pbVar20 = (byte)uVar14;
      target = ParamSpec::InternalSerializeWithCachedSizesToArray(this_47,false,pbVar20 + 1);
      iVar19 = iVar19 + 1;
    } while (iVar19 != iVar2);
  }
  iVar2 = (pLVar9->blobs_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0) {
    iVar19 = 0;
    do {
      this_48 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                          (&(pLVar9->blobs_).super_RepeatedPtrFieldBase,iVar19);
      *target = 0x3a;
      pbVar20 = target + 1;
      uVar16 = this_48->_cached_size_;
      uVar14 = uVar16;
      if (0x7f < uVar16) {
        do {
          *pbVar20 = (byte)uVar16 | 0x80;
          uVar14 = uVar16 >> 7;
          pbVar20 = pbVar20 + 1;
          bVar8 = 0x3fff < uVar16;
          uVar16 = uVar14;
        } while (bVar8);
      }
      *pbVar20 = (byte)uVar14;
      target = BlobProto::InternalSerializeWithCachedSizesToArray(this_48,false,pbVar20 + 1);
      iVar19 = iVar19 + 1;
    } while (iVar19 != iVar2);
  }
  iVar2 = (pLVar9->include_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0) {
    iVar19 = 0;
    do {
      pTVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::NetStateRule>::TypeHandler>
                          (&(pLVar9->include_).super_RepeatedPtrFieldBase,iVar19);
      *target = 0x42;
      pbVar20 = target + 1;
      uVar16 = pTVar13->_cached_size_;
      uVar14 = uVar16;
      if (0x7f < uVar16) {
        do {
          *pbVar20 = (byte)uVar16 | 0x80;
          uVar14 = uVar16 >> 7;
          pbVar20 = pbVar20 + 1;
          bVar8 = 0x3fff < uVar16;
          uVar16 = uVar14;
        } while (bVar8);
      }
      *pbVar20 = (byte)uVar14;
      target = NetStateRule::InternalSerializeWithCachedSizesToArray(pTVar13,false,pbVar20 + 1);
      iVar19 = iVar19 + 1;
    } while (iVar19 != iVar2);
  }
  iVar2 = (pLVar9->exclude_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0) {
    iVar19 = 0;
    do {
      pTVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::NetStateRule>::TypeHandler>
                          (&(pLVar9->exclude_).super_RepeatedPtrFieldBase,iVar19);
      *target = 0x4a;
      pbVar20 = target + 1;
      uVar16 = pTVar13->_cached_size_;
      uVar14 = uVar16;
      if (0x7f < uVar16) {
        do {
          *pbVar20 = (byte)uVar16 | 0x80;
          uVar14 = uVar16 >> 7;
          pbVar20 = pbVar20 + 1;
          bVar8 = 0x3fff < uVar16;
          uVar16 = uVar14;
        } while (bVar8);
      }
      *pbVar20 = (byte)uVar14;
      target = NetStateRule::InternalSerializeWithCachedSizesToArray(pTVar13,false,pbVar20 + 1);
      iVar19 = iVar19 + 1;
    } while (iVar19 != iVar2);
  }
  if ((*(byte *)((long)(pLVar9->_has_bits_).has_bits_ + 6) & 2) != 0) {
    uVar15 = (ulong)pLVar9->phase_;
    pbVar20 = target + 1;
    *target = 0x50;
    uVar17 = uVar15;
    if (0x7f < uVar15) {
      do {
        *pbVar20 = (byte)uVar15 | 0x80;
        uVar17 = uVar15 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar15;
        uVar15 = uVar17;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar17;
    target = pbVar20 + 1;
  }
  uVar16 = (pLVar9->propagate_down_).current_size_;
  if (uVar16 != 0) {
    if ((pLVar9->propagate_down_).rep_ == (Rep *)0x0) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4e2);
      pLVar12 = google::protobuf::internal::LogMessage::operator<<(&local_a0,"CHECK failed: rep_: ")
      ;
      google::protobuf::internal::LogFinisher::operator=(&local_a9,pLVar12);
      google::protobuf::internal::LogMessage::~LogMessage(&local_a0);
    }
    pRVar6 = (pLVar9->propagate_down_).rep_;
    uVar15 = 1;
    if (1 < (int)uVar16) {
      uVar15 = (ulong)uVar16;
    }
    lVar18 = 0;
    uVar17 = 0;
    do {
      bVar8 = pRVar6->elements[uVar17];
      target[uVar17 * 2] = 0x58;
      target[uVar17 * 2 + 1] = bVar8;
      uVar17 = uVar17 + 1;
      lVar18 = lVar18 + -2;
    } while (uVar15 != uVar17);
    target = target + -lVar18;
  }
  uVar16 = (pLVar9->_has_bits_).has_bits_[0];
  if ((uVar16 & 4) != 0) {
    this_00 = pLVar9->transform_param_;
    target[0] = 0xa2;
    target[1] = 6;
    pbVar20 = target + 2;
    uVar14 = this_00->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = TransformationParameter::InternalSerializeWithCachedSizesToArray
                       (this_00,false,pbVar20 + 1);
  }
  if ((uVar16 & 8) != 0) {
    this_01 = pLVar9->loss_param_;
    target[0] = 0xaa;
    target[1] = 6;
    pbVar20 = target + 2;
    uVar14 = this_01->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = LossParameter::InternalSerializeWithCachedSizesToArray(this_01,false,pbVar20 + 1);
  }
  if ((uVar16 & 0x10) != 0) {
    this_02 = pLVar9->accuracy_param_;
    target[0] = 0xb2;
    target[1] = 6;
    pbVar20 = target + 2;
    uVar14 = this_02->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = AccuracyParameter::InternalSerializeWithCachedSizesToArray(this_02,false,pbVar20 + 1);
  }
  if ((uVar16 & 0x20) != 0) {
    this_03 = pLVar9->argmax_param_;
    target[0] = 0xba;
    target[1] = 6;
    pbVar20 = target + 2;
    uVar14 = this_03->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = ArgMaxParameter::InternalSerializeWithCachedSizesToArray(this_03,false,pbVar20 + 1);
  }
  if ((uVar16 & 0x40) != 0) {
    this_04 = pLVar9->concat_param_;
    target[0] = 0xc2;
    target[1] = 6;
    pbVar20 = target + 2;
    uVar14 = this_04->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = ConcatParameter::InternalSerializeWithCachedSizesToArray(this_04,false,pbVar20 + 1);
  }
  if ((char)uVar16 < '\0') {
    this_05 = pLVar9->contrastive_loss_param_;
    target[0] = 0xca;
    target[1] = 6;
    pbVar20 = target + 2;
    uVar14 = this_05->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = ContrastiveLossParameter::InternalSerializeWithCachedSizesToArray
                       (this_05,false,pbVar20 + 1);
  }
  if ((uVar16 >> 8 & 1) != 0) {
    this_06 = pLVar9->convolution_param_;
    target[0] = 0xd2;
    target[1] = 6;
    pbVar20 = target + 2;
    uVar14 = this_06->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = ConvolutionParameter::InternalSerializeWithCachedSizesToArray
                       (this_06,false,pbVar20 + 1);
  }
  if ((uVar16 >> 9 & 1) != 0) {
    this_07 = pLVar9->data_param_;
    target[0] = 0xda;
    target[1] = 6;
    pbVar20 = target + 2;
    uVar14 = this_07->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = DataParameter::InternalSerializeWithCachedSizesToArray(this_07,false,pbVar20 + 1);
  }
  if ((uVar16 >> 10 & 1) != 0) {
    this_08 = pLVar9->dropout_param_;
    target[0] = 0xe2;
    target[1] = 6;
    pbVar20 = target + 2;
    uVar14 = this_08->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = DropoutParameter::InternalSerializeWithCachedSizesToArray(this_08,false,pbVar20 + 1);
  }
  if ((uVar16 >> 0xb & 1) != 0) {
    this_09 = pLVar9->dummy_data_param_;
    target[0] = 0xea;
    target[1] = 6;
    pbVar20 = target + 2;
    uVar14 = this_09->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = DummyDataParameter::InternalSerializeWithCachedSizesToArray(this_09,false,pbVar20 + 1);
  }
  if ((uVar16 >> 0xc & 1) != 0) {
    this_10 = pLVar9->eltwise_param_;
    target[0] = 0xf2;
    target[1] = 6;
    pbVar20 = target + 2;
    uVar14 = this_10->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = EltwiseParameter::InternalSerializeWithCachedSizesToArray(this_10,false,pbVar20 + 1);
  }
  if ((uVar16 >> 0xd & 1) != 0) {
    this_11 = pLVar9->exp_param_;
    target[0] = 0xfa;
    target[1] = 6;
    pbVar20 = target + 2;
    uVar14 = this_11->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = ExpParameter::InternalSerializeWithCachedSizesToArray(this_11,false,pbVar20 + 1);
  }
  if ((uVar16 >> 0xe & 1) != 0) {
    this_12 = pLVar9->hdf5_data_param_;
    target[0] = 0x82;
    target[1] = 7;
    pbVar20 = target + 2;
    uVar14 = this_12->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = HDF5DataParameter::InternalSerializeWithCachedSizesToArray(this_12,false,pbVar20 + 1);
  }
  if ((short)uVar16 < 0) {
    this_13 = pLVar9->hdf5_output_param_;
    target[0] = 0x8a;
    target[1] = 7;
    pbVar20 = target + 2;
    uVar14 = this_13->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = HDF5OutputParameter::InternalSerializeWithCachedSizesToArray(this_13,false,pbVar20 + 1)
    ;
  }
  if ((uVar16 >> 0x10 & 1) != 0) {
    this_14 = pLVar9->hinge_loss_param_;
    target[0] = 0x92;
    target[1] = 7;
    pbVar20 = target + 2;
    uVar14 = this_14->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = HingeLossParameter::InternalSerializeWithCachedSizesToArray(this_14,false,pbVar20 + 1);
  }
  if ((uVar16 >> 0x11 & 1) != 0) {
    this_15 = pLVar9->image_data_param_;
    target[0] = 0x9a;
    target[1] = 7;
    pbVar20 = target + 2;
    uVar14 = this_15->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = ImageDataParameter::InternalSerializeWithCachedSizesToArray(this_15,false,pbVar20 + 1);
  }
  if ((uVar16 >> 0x12 & 1) != 0) {
    this_16 = pLVar9->infogain_loss_param_;
    target[0] = 0xa2;
    target[1] = 7;
    pbVar20 = target + 2;
    uVar14 = this_16->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = InfogainLossParameter::InternalSerializeWithCachedSizesToArray
                       (this_16,false,pbVar20 + 1);
  }
  if ((uVar16 >> 0x13 & 1) != 0) {
    this_17 = pLVar9->inner_product_param_;
    target[0] = 0xaa;
    target[1] = 7;
    pbVar20 = target + 2;
    uVar14 = this_17->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = InnerProductParameter::InternalSerializeWithCachedSizesToArray
                       (this_17,false,pbVar20 + 1);
  }
  if ((uVar16 >> 0x14 & 1) != 0) {
    this_18 = pLVar9->lrn_param_;
    target[0] = 0xb2;
    target[1] = 7;
    pbVar20 = target + 2;
    uVar14 = this_18->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = LRNParameter::InternalSerializeWithCachedSizesToArray(this_18,false,pbVar20 + 1);
  }
  if ((uVar16 >> 0x15 & 1) != 0) {
    this_19 = pLVar9->memory_data_param_;
    target[0] = 0xba;
    target[1] = 7;
    pbVar20 = target + 2;
    uVar14 = this_19->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = MemoryDataParameter::InternalSerializeWithCachedSizesToArray(this_19,false,pbVar20 + 1)
    ;
  }
  if ((uVar16 >> 0x16 & 1) != 0) {
    this_20 = pLVar9->mvn_param_;
    target[0] = 0xc2;
    target[1] = 7;
    pbVar20 = target + 2;
    uVar14 = this_20->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = MVNParameter::InternalSerializeWithCachedSizesToArray(this_20,false,pbVar20 + 1);
  }
  if ((uVar16 >> 0x17 & 1) != 0) {
    this_21 = pLVar9->pooling_param_;
    target[0] = 0xca;
    target[1] = 7;
    pbVar20 = target + 2;
    uVar14 = this_21->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = PoolingParameter::InternalSerializeWithCachedSizesToArray(this_21,false,pbVar20 + 1);
  }
  if ((uVar16 >> 0x18 & 1) != 0) {
    this_22 = pLVar9->power_param_;
    target[0] = 0xd2;
    target[1] = 7;
    pbVar20 = target + 2;
    uVar14 = this_22->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = PowerParameter::InternalSerializeWithCachedSizesToArray(this_22,false,pbVar20 + 1);
  }
  if ((uVar16 >> 0x19 & 1) != 0) {
    this_23 = pLVar9->relu_param_;
    target[0] = 0xda;
    target[1] = 7;
    pbVar20 = target + 2;
    uVar14 = this_23->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = ReLUParameter::InternalSerializeWithCachedSizesToArray(this_23,false,pbVar20 + 1);
  }
  if ((uVar16 >> 0x1a & 1) != 0) {
    this_24 = pLVar9->sigmoid_param_;
    target[0] = 0xe2;
    target[1] = 7;
    pbVar20 = target + 2;
    uVar14 = this_24->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = SigmoidParameter::InternalSerializeWithCachedSizesToArray(this_24,false,pbVar20 + 1);
  }
  if ((uVar16 >> 0x1b & 1) != 0) {
    this_25 = pLVar9->softmax_param_;
    target[0] = 0xea;
    target[1] = 7;
    pbVar20 = target + 2;
    uVar14 = this_25->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = SoftmaxParameter::InternalSerializeWithCachedSizesToArray(this_25,false,pbVar20 + 1);
  }
  if ((uVar16 >> 0x1c & 1) != 0) {
    this_26 = pLVar9->slice_param_;
    target[0] = 0xf2;
    target[1] = 7;
    pbVar20 = target + 2;
    uVar14 = this_26->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = SliceParameter::InternalSerializeWithCachedSizesToArray(this_26,false,pbVar20 + 1);
  }
  if ((uVar16 >> 0x1d & 1) != 0) {
    this_27 = pLVar9->tanh_param_;
    target[0] = 0xfa;
    target[1] = 7;
    pbVar20 = target + 2;
    uVar14 = this_27->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = TanHParameter::InternalSerializeWithCachedSizesToArray(this_27,false,pbVar20 + 1);
  }
  if ((uVar16 >> 0x1e & 1) != 0) {
    this_28 = pLVar9->threshold_param_;
    target[0] = 0x82;
    target[1] = 8;
    pbVar20 = target + 2;
    uVar14 = this_28->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = ThresholdParameter::InternalSerializeWithCachedSizesToArray(this_28,false,pbVar20 + 1);
  }
  if ((int)uVar16 < 0) {
    this_29 = pLVar9->window_data_param_;
    target[0] = 0x8a;
    target[1] = 8;
    pbVar20 = target + 2;
    uVar16 = this_29->_cached_size_;
    uVar14 = uVar16;
    if (0x7f < uVar16) {
      do {
        *pbVar20 = (byte)uVar16 | 0x80;
        uVar14 = uVar16 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar16;
        uVar16 = uVar14;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar14;
    target = WindowDataParameter::InternalSerializeWithCachedSizesToArray(this_29,false,pbVar20 + 1)
    ;
  }
  uVar16 = (pLVar9->_has_bits_).has_bits_[1];
  if ((uVar16 & 1) != 0) {
    this_30 = pLVar9->python_param_;
    target[0] = 0x92;
    target[1] = 8;
    pbVar20 = target + 2;
    uVar14 = this_30->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = PythonParameter::InternalSerializeWithCachedSizesToArray(this_30,false,pbVar20 + 1);
  }
  if ((uVar16 & 2) != 0) {
    this_31 = pLVar9->prelu_param_;
    target[0] = 0x9a;
    target[1] = 8;
    pbVar20 = target + 2;
    uVar14 = this_31->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = PReLUParameter::InternalSerializeWithCachedSizesToArray(this_31,false,pbVar20 + 1);
  }
  if ((uVar16 & 4) != 0) {
    this_32 = pLVar9->spp_param_;
    target[0] = 0xa2;
    target[1] = 8;
    pbVar20 = target + 2;
    uVar14 = this_32->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = SPPParameter::InternalSerializeWithCachedSizesToArray(this_32,false,pbVar20 + 1);
  }
  if ((uVar16 & 8) != 0) {
    this_33 = pLVar9->reshape_param_;
    target[0] = 0xaa;
    target[1] = 8;
    pbVar20 = target + 2;
    uVar14 = this_33->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = ReshapeParameter::InternalSerializeWithCachedSizesToArray(this_33,false,pbVar20 + 1);
  }
  if ((uVar16 & 0x10) != 0) {
    this_34 = pLVar9->log_param_;
    target[0] = 0xb2;
    target[1] = 8;
    pbVar20 = target + 2;
    uVar14 = this_34->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = LogParameter::InternalSerializeWithCachedSizesToArray(this_34,false,pbVar20 + 1);
  }
  if ((uVar16 & 0x20) != 0) {
    this_35 = pLVar9->flatten_param_;
    target[0] = 0xba;
    target[1] = 8;
    pbVar20 = target + 2;
    uVar14 = this_35->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = FlattenParameter::InternalSerializeWithCachedSizesToArray(this_35,false,pbVar20 + 1);
  }
  if ((uVar16 & 0x40) != 0) {
    this_36 = pLVar9->reduction_param_;
    target[0] = 0xc2;
    target[1] = 8;
    pbVar20 = target + 2;
    uVar14 = this_36->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = ReductionParameter::InternalSerializeWithCachedSizesToArray(this_36,false,pbVar20 + 1);
  }
  if ((char)uVar16 < '\0') {
    this_37 = pLVar9->embed_param_;
    target[0] = 0xca;
    target[1] = 8;
    pbVar20 = target + 2;
    uVar14 = this_37->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = EmbedParameter::InternalSerializeWithCachedSizesToArray(this_37,false,pbVar20 + 1);
  }
  if ((uVar16 >> 8 & 1) != 0) {
    this_38 = pLVar9->tile_param_;
    target[0] = 0xd2;
    target[1] = 8;
    pbVar20 = target + 2;
    uVar14 = this_38->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = TileParameter::InternalSerializeWithCachedSizesToArray(this_38,false,pbVar20 + 1);
  }
  if ((uVar16 >> 9 & 1) != 0) {
    this_39 = pLVar9->batch_norm_param_;
    target[0] = 0xda;
    target[1] = 8;
    pbVar20 = target + 2;
    uVar14 = this_39->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = BatchNormParameter::InternalSerializeWithCachedSizesToArray(this_39,false,pbVar20 + 1);
  }
  if ((uVar16 >> 10 & 1) != 0) {
    this_40 = pLVar9->elu_param_;
    target[0] = 0xe2;
    target[1] = 8;
    pbVar20 = target + 2;
    uVar14 = this_40->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = ELUParameter::InternalSerializeWithCachedSizesToArray(this_40,false,pbVar20 + 1);
  }
  if ((uVar16 >> 0xb & 1) != 0) {
    this_41 = pLVar9->bias_param_;
    target[0] = 0xea;
    target[1] = 8;
    pbVar20 = target + 2;
    uVar14 = this_41->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = BiasParameter::InternalSerializeWithCachedSizesToArray(this_41,false,pbVar20 + 1);
  }
  if ((uVar16 >> 0xc & 1) != 0) {
    this_42 = pLVar9->scale_param_;
    target[0] = 0xf2;
    target[1] = 8;
    pbVar20 = target + 2;
    uVar14 = this_42->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = ScaleParameter::InternalSerializeWithCachedSizesToArray(this_42,false,pbVar20 + 1);
  }
  if ((uVar16 >> 0xd & 1) != 0) {
    this_43 = pLVar9->input_param_;
    target[0] = 0xfa;
    target[1] = 8;
    pbVar20 = target + 2;
    uVar14 = this_43->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = InputParameter::InternalSerializeWithCachedSizesToArray(this_43,false,pbVar20 + 1);
  }
  if ((uVar16 >> 0xe & 1) != 0) {
    this_44 = pLVar9->crop_param_;
    target[0] = 0x82;
    target[1] = 9;
    pbVar20 = target + 2;
    uVar14 = this_44->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = CropParameter::InternalSerializeWithCachedSizesToArray(this_44,false,pbVar20 + 1);
  }
  if ((short)uVar16 < 0) {
    this_45 = pLVar9->parameter_param_;
    target[0] = 0x8a;
    target[1] = 9;
    pbVar20 = target + 2;
    uVar14 = this_45->_cached_size_;
    uVar10 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar20 = (byte)uVar14 | 0x80;
        uVar10 = uVar14 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar14;
        uVar14 = uVar10;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar10;
    target = ParameterParameter::InternalSerializeWithCachedSizesToArray(this_45,false,pbVar20 + 1);
  }
  if ((uVar16 >> 0x10 & 1) != 0) {
    this_46 = pLVar9->recurrent_param_;
    target[0] = 0x92;
    target[1] = 9;
    pbVar20 = target + 2;
    uVar16 = this_46->_cached_size_;
    uVar14 = uVar16;
    if (0x7f < uVar16) {
      do {
        *pbVar20 = (byte)uVar16 | 0x80;
        uVar14 = uVar16 >> 7;
        pbVar20 = pbVar20 + 1;
        bVar8 = 0x3fff < uVar16;
        uVar16 = uVar14;
      } while (bVar8);
    }
    *pbVar20 = (byte)uVar14;
    target = RecurrentParameter::InternalSerializeWithCachedSizesToArray(this_46,false,pbVar20 + 1);
  }
  pvVar7 = (pLVar9->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar7 & 1) != 0) {
    target = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar7 & 0xfffffffffffffffe),target);
  }
  return target;
}

Assistant:

::google::protobuf::uint8* LayerParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.LayerParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.LayerParameter.name");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // optional string type = 2;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->type().data(), this->type().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.LayerParameter.type");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        2, this->type(), target);
  }

  // repeated string bottom = 3;
  for (int i = 0, n = this->bottom_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->bottom(i).data(), this->bottom(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.LayerParameter.bottom");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(3, this->bottom(i), target);
  }

  // repeated string top = 4;
  for (int i = 0, n = this->top_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->top(i).data(), this->top(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.LayerParameter.top");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(4, this->top(i), target);
  }

  // repeated float loss_weight = 5;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteFloatToArray(5, this->loss_weight_, target);

  // repeated .caffe.ParamSpec param = 6;
  for (unsigned int i = 0, n = this->param_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        6, this->param(i), deterministic, target);
  }

  // repeated .caffe.BlobProto blobs = 7;
  for (unsigned int i = 0, n = this->blobs_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        7, this->blobs(i), deterministic, target);
  }

  // repeated .caffe.NetStateRule include = 8;
  for (unsigned int i = 0, n = this->include_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        8, this->include(i), deterministic, target);
  }

  // repeated .caffe.NetStateRule exclude = 9;
  for (unsigned int i = 0, n = this->exclude_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        9, this->exclude(i), deterministic, target);
  }

  cached_has_bits = _has_bits_[1];
  // optional .caffe.Phase phase = 10;
  if (cached_has_bits & 0x00020000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      10, this->phase(), target);
  }

  // repeated bool propagate_down = 11;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteBoolToArray(11, this->propagate_down_, target);

  cached_has_bits = _has_bits_[0];
  // optional .caffe.TransformationParameter transform_param = 100;
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        100, *this->transform_param_, deterministic, target);
  }

  // optional .caffe.LossParameter loss_param = 101;
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        101, *this->loss_param_, deterministic, target);
  }

  // optional .caffe.AccuracyParameter accuracy_param = 102;
  if (cached_has_bits & 0x00000010u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        102, *this->accuracy_param_, deterministic, target);
  }

  // optional .caffe.ArgMaxParameter argmax_param = 103;
  if (cached_has_bits & 0x00000020u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        103, *this->argmax_param_, deterministic, target);
  }

  // optional .caffe.ConcatParameter concat_param = 104;
  if (cached_has_bits & 0x00000040u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        104, *this->concat_param_, deterministic, target);
  }

  // optional .caffe.ContrastiveLossParameter contrastive_loss_param = 105;
  if (cached_has_bits & 0x00000080u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        105, *this->contrastive_loss_param_, deterministic, target);
  }

  // optional .caffe.ConvolutionParameter convolution_param = 106;
  if (cached_has_bits & 0x00000100u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        106, *this->convolution_param_, deterministic, target);
  }

  // optional .caffe.DataParameter data_param = 107;
  if (cached_has_bits & 0x00000200u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        107, *this->data_param_, deterministic, target);
  }

  // optional .caffe.DropoutParameter dropout_param = 108;
  if (cached_has_bits & 0x00000400u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        108, *this->dropout_param_, deterministic, target);
  }

  // optional .caffe.DummyDataParameter dummy_data_param = 109;
  if (cached_has_bits & 0x00000800u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        109, *this->dummy_data_param_, deterministic, target);
  }

  // optional .caffe.EltwiseParameter eltwise_param = 110;
  if (cached_has_bits & 0x00001000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        110, *this->eltwise_param_, deterministic, target);
  }

  // optional .caffe.ExpParameter exp_param = 111;
  if (cached_has_bits & 0x00002000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        111, *this->exp_param_, deterministic, target);
  }

  // optional .caffe.HDF5DataParameter hdf5_data_param = 112;
  if (cached_has_bits & 0x00004000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        112, *this->hdf5_data_param_, deterministic, target);
  }

  // optional .caffe.HDF5OutputParameter hdf5_output_param = 113;
  if (cached_has_bits & 0x00008000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        113, *this->hdf5_output_param_, deterministic, target);
  }

  // optional .caffe.HingeLossParameter hinge_loss_param = 114;
  if (cached_has_bits & 0x00010000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        114, *this->hinge_loss_param_, deterministic, target);
  }

  // optional .caffe.ImageDataParameter image_data_param = 115;
  if (cached_has_bits & 0x00020000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        115, *this->image_data_param_, deterministic, target);
  }

  // optional .caffe.InfogainLossParameter infogain_loss_param = 116;
  if (cached_has_bits & 0x00040000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        116, *this->infogain_loss_param_, deterministic, target);
  }

  // optional .caffe.InnerProductParameter inner_product_param = 117;
  if (cached_has_bits & 0x00080000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        117, *this->inner_product_param_, deterministic, target);
  }

  // optional .caffe.LRNParameter lrn_param = 118;
  if (cached_has_bits & 0x00100000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        118, *this->lrn_param_, deterministic, target);
  }

  // optional .caffe.MemoryDataParameter memory_data_param = 119;
  if (cached_has_bits & 0x00200000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        119, *this->memory_data_param_, deterministic, target);
  }

  // optional .caffe.MVNParameter mvn_param = 120;
  if (cached_has_bits & 0x00400000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        120, *this->mvn_param_, deterministic, target);
  }

  // optional .caffe.PoolingParameter pooling_param = 121;
  if (cached_has_bits & 0x00800000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        121, *this->pooling_param_, deterministic, target);
  }

  // optional .caffe.PowerParameter power_param = 122;
  if (cached_has_bits & 0x01000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        122, *this->power_param_, deterministic, target);
  }

  // optional .caffe.ReLUParameter relu_param = 123;
  if (cached_has_bits & 0x02000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        123, *this->relu_param_, deterministic, target);
  }

  // optional .caffe.SigmoidParameter sigmoid_param = 124;
  if (cached_has_bits & 0x04000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        124, *this->sigmoid_param_, deterministic, target);
  }

  // optional .caffe.SoftmaxParameter softmax_param = 125;
  if (cached_has_bits & 0x08000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        125, *this->softmax_param_, deterministic, target);
  }

  // optional .caffe.SliceParameter slice_param = 126;
  if (cached_has_bits & 0x10000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        126, *this->slice_param_, deterministic, target);
  }

  // optional .caffe.TanHParameter tanh_param = 127;
  if (cached_has_bits & 0x20000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        127, *this->tanh_param_, deterministic, target);
  }

  // optional .caffe.ThresholdParameter threshold_param = 128;
  if (cached_has_bits & 0x40000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        128, *this->threshold_param_, deterministic, target);
  }

  // optional .caffe.WindowDataParameter window_data_param = 129;
  if (cached_has_bits & 0x80000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        129, *this->window_data_param_, deterministic, target);
  }

  cached_has_bits = _has_bits_[1];
  // optional .caffe.PythonParameter python_param = 130;
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        130, *this->python_param_, deterministic, target);
  }

  // optional .caffe.PReLUParameter prelu_param = 131;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        131, *this->prelu_param_, deterministic, target);
  }

  // optional .caffe.SPPParameter spp_param = 132;
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        132, *this->spp_param_, deterministic, target);
  }

  // optional .caffe.ReshapeParameter reshape_param = 133;
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        133, *this->reshape_param_, deterministic, target);
  }

  // optional .caffe.LogParameter log_param = 134;
  if (cached_has_bits & 0x00000010u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        134, *this->log_param_, deterministic, target);
  }

  // optional .caffe.FlattenParameter flatten_param = 135;
  if (cached_has_bits & 0x00000020u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        135, *this->flatten_param_, deterministic, target);
  }

  // optional .caffe.ReductionParameter reduction_param = 136;
  if (cached_has_bits & 0x00000040u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        136, *this->reduction_param_, deterministic, target);
  }

  // optional .caffe.EmbedParameter embed_param = 137;
  if (cached_has_bits & 0x00000080u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        137, *this->embed_param_, deterministic, target);
  }

  // optional .caffe.TileParameter tile_param = 138;
  if (cached_has_bits & 0x00000100u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        138, *this->tile_param_, deterministic, target);
  }

  // optional .caffe.BatchNormParameter batch_norm_param = 139;
  if (cached_has_bits & 0x00000200u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        139, *this->batch_norm_param_, deterministic, target);
  }

  // optional .caffe.ELUParameter elu_param = 140;
  if (cached_has_bits & 0x00000400u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        140, *this->elu_param_, deterministic, target);
  }

  // optional .caffe.BiasParameter bias_param = 141;
  if (cached_has_bits & 0x00000800u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        141, *this->bias_param_, deterministic, target);
  }

  // optional .caffe.ScaleParameter scale_param = 142;
  if (cached_has_bits & 0x00001000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        142, *this->scale_param_, deterministic, target);
  }

  // optional .caffe.InputParameter input_param = 143;
  if (cached_has_bits & 0x00002000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        143, *this->input_param_, deterministic, target);
  }

  // optional .caffe.CropParameter crop_param = 144;
  if (cached_has_bits & 0x00004000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        144, *this->crop_param_, deterministic, target);
  }

  // optional .caffe.ParameterParameter parameter_param = 145;
  if (cached_has_bits & 0x00008000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        145, *this->parameter_param_, deterministic, target);
  }

  // optional .caffe.RecurrentParameter recurrent_param = 146;
  if (cached_has_bits & 0x00010000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        146, *this->recurrent_param_, deterministic, target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.LayerParameter)
  return target;
}